

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::DelItem(Character *this,short item,int amount)

{
  int iVar1;
  const_iterator __position;
  list<Character_Item,_std::allocator<Character_Item>_> *this_00;
  
  if (amount < 1) {
    return false;
  }
  this_00 = &this->inventory;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      return false;
    }
  } while (*(short *)&__position._M_node[1]._M_next != item);
  iVar1 = *(int *)((long)&__position._M_node[1]._M_next + 4);
  if ((iVar1 < 0) || (iVar1 - amount == 0 || iVar1 < amount)) {
    std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase(this_00,__position);
  }
  else {
    *(int *)((long)&__position._M_node[1]._M_next + 4) = iVar1 - amount;
  }
  CalculateStats(this,true);
  return true;
}

Assistant:

bool Character::DelItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount < 0 || it->amount - amount <= 0)
			{
				this->inventory.erase(it);
			}
			else
			{
				it->amount -= amount;
			}

			this->CalculateStats();

			return true;
		}
	}

	return false;
}